

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.h
# Opt level: O2

void __thiscall
Blip_Synth<12,_15>::offset_resampled
          (Blip_Synth<12,_15> *this,blip_resampled_time_t time,int delta,Blip_Buffer *blip_buf)

{
  buf_t_ *pbVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = delta * (this->impl).delta_factor;
  pbVar1 = blip_buf->buffer_;
  uVar2 = (ulong)(time >> 0x10);
  uVar4 = (ulong)(time >> 9 & 0x7e);
  pbVar1[uVar2 + 2] = pbVar1[uVar2 + 2] + *(short *)((long)this + (0xa8 - uVar4)) * iVar3;
  pbVar1[uVar2 + 3] = pbVar1[uVar2 + 3] + *(short *)((long)this + (0x128 - uVar4)) * iVar3;
  pbVar1[uVar2 + 4] = pbVar1[uVar2 + 4] + *(short *)((long)this + (0x1a8 - uVar4)) * iVar3;
  pbVar1[uVar2 + 5] = pbVar1[uVar2 + 5] + *(short *)((long)this + (0x228 - uVar4)) * iVar3;
  pbVar1[uVar2 + 6] = pbVar1[uVar2 + 6] + *(short *)((long)this + (0x2a8 - uVar4)) * iVar3;
  pbVar1[uVar2 + 7] = pbVar1[uVar2 + 7] + *(short *)((long)this + (0x328 - uVar4)) * iVar3;
  pbVar1[uVar2 + 8] = pbVar1[uVar2 + 8] + *(short *)((long)this->impulses + uVar4 + 0x280) * iVar3;
  pbVar1[uVar2 + 9] = pbVar1[uVar2 + 9] + *(short *)((long)this->impulses + uVar4 + 0x200) * iVar3;
  pbVar1[uVar2 + 10] = pbVar1[uVar2 + 10] + *(short *)((long)this->impulses + uVar4 + 0x180) * iVar3
  ;
  pbVar1[uVar2 + 0xb] =
       pbVar1[uVar2 + 0xb] + *(short *)((long)this->impulses + uVar4 + 0x100) * iVar3;
  pbVar1[uVar2 + 0xc] =
       pbVar1[uVar2 + 0xc] + *(short *)((long)this->impulses + uVar4 + 0x80) * iVar3;
  pbVar1[uVar2 + 0xd] = pbVar1[uVar2 + 0xd] + *(short *)((long)this->impulses + uVar4) * iVar3;
  return;
}

Assistant:

inline void Blip_Synth<quality,range>::offset_resampled( blip_resampled_time_t time,
		int delta, Blip_Buffer* blip_buf ) const
{
	// Fails if time is beyond end of Blip_Buffer, due to a bug in caller code or the
	// need for a longer buffer as set by set_sample_rate().
	assert( (blip_long) (time >> BLIP_BUFFER_ACCURACY) < blip_buf->buffer_size_ );
	delta *= impl.delta_factor;
	blip_long* BLIP_RESTRICT buf = blip_buf->buffer_ + (time >> BLIP_BUFFER_ACCURACY);
	int phase = (int) (time >> (BLIP_BUFFER_ACCURACY - BLIP_PHASE_BITS) & (blip_res - 1));

#if BLIP_BUFFER_FAST
	blip_long left = buf [0] + delta;
	
	// Kind of crappy, but doing shift after multiply results in overflow.
	// Alternate way of delaying multiply by delta_factor results in worse
	// sub-sample resolution.
	blip_long right = (delta >> BLIP_PHASE_BITS) * phase;
	left  -= right;
	right += buf [1];
	
	buf [0] = left;
	buf [1] = right;
#else

	int const fwd = (blip_widest_impulse_ - quality) / 2;
	int const rev = fwd + quality - 2;
	int const mid = quality / 2 - 1;
	
	imp_t const* BLIP_RESTRICT imp = impulses + blip_res - phase;
	
	#if defined (_M_IX86) || defined (_M_IA64) || defined (__i486__) || \
			defined (__x86_64__) || defined (__ia64__) || defined (__i386__)
	
	// straight forward implementation resulted in better code on GCC for x86
	
	#define ADD_IMP( out, in ) \
		buf [out] += (blip_long) imp [blip_res * (in)] * delta
	
	#define BLIP_FWD( i ) {\
		ADD_IMP( fwd     + i, i     );\
		ADD_IMP( fwd + 1 + i, i + 1 );\
	}
	#define BLIP_REV( r ) {\
		ADD_IMP( rev     - r, r + 1 );\
		ADD_IMP( rev + 1 - r, r     );\
	}

		BLIP_FWD( 0 )
		if ( quality > 8  ) BLIP_FWD( 2 )
		if ( quality > 12 ) BLIP_FWD( 4 )
		{
			ADD_IMP( fwd + mid - 1, mid - 1 );
			ADD_IMP( fwd + mid    , mid     );
			imp = impulses + phase;
		}
		if ( quality > 12 ) BLIP_REV( 6 )
		if ( quality > 8  ) BLIP_REV( 4 )
		BLIP_REV( 2 )
		
		ADD_IMP( rev    , 1 );
		ADD_IMP( rev + 1, 0 );
		
	#else
	
	// for RISC processors, help compiler by reading ahead of writes
	
	#define BLIP_FWD( i ) {\
		blip_long t0 =                       i0 * delta + buf [fwd     + i];\
		blip_long t1 = imp [blip_res * (i + 1)] * delta + buf [fwd + 1 + i];\
		i0 =           imp [blip_res * (i + 2)];\
		buf [fwd     + i] = t0;\
		buf [fwd + 1 + i] = t1;\
	}
	#define BLIP_REV( r ) {\
		blip_long t0 =                 i0 * delta + buf [rev     - r];\
		blip_long t1 = imp [blip_res * r] * delta + buf [rev + 1 - r];\
		i0 =           imp [blip_res * (r - 1)];\
		buf [rev     - r] = t0;\
		buf [rev + 1 - r] = t1;\
	}
		
		blip_long i0 = *imp;
		BLIP_FWD( 0 )
		if ( quality > 8  ) BLIP_FWD( 2 )
		if ( quality > 12 ) BLIP_FWD( 4 )
		{
			blip_long t0 =                   i0 * delta + buf [fwd + mid - 1];
			blip_long t1 = imp [blip_res * mid] * delta + buf [fwd + mid    ];
			imp = impulses + phase;
			i0 = imp [blip_res * mid];
			buf [fwd + mid - 1] = t0;
			buf [fwd + mid    ] = t1;
		}
		if ( quality > 12 ) BLIP_REV( 6 )
		if ( quality > 8  ) BLIP_REV( 4 )
		BLIP_REV( 2 )
		
		blip_long t0 =   i0 * delta + buf [rev    ];
		blip_long t1 = *imp * delta + buf [rev + 1];
		buf [rev    ] = t0;
		buf [rev + 1] = t1;
	#endif
	
#endif
}